

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueInfo.cpp
# Opt level: O0

ValueInfo * __thiscall ValueInfo::SpecializeToFloat64(ValueInfo *this,JitArenaAllocator *allocator)

{
  bool bVar1;
  ValueType *pVVar2;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_2a;
  ValueInfo *newValueInfo;
  JitArenaAllocator *allocator_local;
  ValueInfo *this_local;
  
  bVar1 = ValueType::IsNumber(&this->super_ValueType);
  this_local = this;
  if (!bVar1) {
    this_local = CopyWithGenericStructureKind(this,allocator);
    bVar1 = ValueType::IsLikelyInt(&this->super_ValueType);
    if (bVar1) {
      pVVar2 = Type(this);
      local_2a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToDefiniteAnyNumber(pVVar2);
    }
    else {
      pVVar2 = Type(this);
      local_2a.field_0 =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           ValueType::ToDefiniteAnyFloat(pVVar2);
    }
    paVar3 = &Type(this_local)->field_0;
    paVar3->field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)local_2a;
  }
  return this_local;
}

Assistant:

ValueInfo *
ValueInfo::SpecializeToFloat64(JitArenaAllocator *const allocator)
{
    if (IsNumber())
    {
        return this;
    }

    ValueInfo *const newValueInfo = CopyWithGenericStructureKind(allocator);

    // If the value type was likely int, after float-specializing, it's preferable to use Int_Number rather than Float, as the
    // former is also likely int and allows int specialization later.
    newValueInfo->Type() = IsLikelyInt() ? Type().ToDefiniteAnyNumber() : Type().ToDefiniteAnyFloat();

    return newValueInfo;
}